

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O3

void __thiscall
LatencyDecodingSynapse::LatencyDecodingSynapse
          (LatencyDecodingSynapse *this,Population *n_from,Population *n_to)

{
  LatencyDecodingSynapse_param *pLVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00110d60;
  pLVar1 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  pLVar1->window_length_s = 0.5;
  pLVar1->delay_s = 0.0;
  this->param = pLVar1;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

LatencyDecodingSynapse::LatencyDecodingSynapse(Population* n_from, Population* n_to) : 
    param(new LatencyDecodingSynapse_param)
{
    initialize(n_from, n_to);
}